

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

xmlChar * htmlFindEncoding(xmlParserCtxtPtr ctxt)

{
  xmlChar *pxVar1;
  bool bVar2;
  xmlChar *ret;
  xmlChar *end;
  xmlChar *cur;
  xmlChar *start;
  xmlParserCtxtPtr ctxt_local;
  
  if (((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->input == (xmlParserInputPtr)0x0)) ||
     ((ctxt->input->flags & 1U) != 0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else if ((ctxt->input->cur == (xmlChar *)0x0) || (ctxt->input->end == (xmlChar *)0x0)) {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else if (*ctxt->input->end == '\0') {
    pxVar1 = xmlStrcasestr(ctxt->input->cur,(xmlChar *)"HTTP-EQUIV");
    if (pxVar1 == (xmlChar *)0x0) {
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      pxVar1 = xmlStrcasestr(pxVar1,(xmlChar *)"CONTENT");
      if (pxVar1 == (xmlChar *)0x0) {
        ctxt_local = (xmlParserCtxtPtr)0x0;
      }
      else {
        pxVar1 = xmlStrcasestr(pxVar1,(xmlChar *)"CHARSET=");
        if (pxVar1 == (xmlChar *)0x0) {
          ctxt_local = (xmlParserCtxtPtr)0x0;
        }
        else {
          pxVar1 = pxVar1 + 8;
          end = pxVar1;
          while( true ) {
            if (((((*end | 0x20) < 0x61) || (bVar2 = true, 0x7a < (*end | 0x20))) &&
                ((*end < 0x30 || (bVar2 = true, 0x39 < *end)))) &&
               (((bVar2 = true, *end != '-' && (bVar2 = true, *end != '_')) &&
                (bVar2 = true, *end != ':')))) {
              bVar2 = *end == '/';
            }
            if (!bVar2) break;
            end = end + 1;
          }
          if (end == pxVar1) {
            ctxt_local = (xmlParserCtxtPtr)0x0;
          }
          else {
            ctxt_local = (xmlParserCtxtPtr)xmlStrndup(pxVar1,(int)end - (int)pxVar1);
            if (ctxt_local == (xmlParserCtxtPtr)0x0) {
              htmlErrMemory(ctxt);
            }
          }
        }
      }
    }
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static xmlChar *
htmlFindEncoding(xmlParserCtxtPtr ctxt) {
    const xmlChar *start, *cur, *end;
    xmlChar *ret;

    if ((ctxt == NULL) || (ctxt->input == NULL) ||
        (ctxt->input->flags & XML_INPUT_HAS_ENCODING))
        return(NULL);
    if ((ctxt->input->cur == NULL) || (ctxt->input->end == NULL))
        return(NULL);

    start = ctxt->input->cur;
    end = ctxt->input->end;
    /* we also expect the input buffer to be zero terminated */
    if (*end != 0)
        return(NULL);

    cur = xmlStrcasestr(start, BAD_CAST "HTTP-EQUIV");
    if (cur == NULL)
        return(NULL);
    cur = xmlStrcasestr(cur, BAD_CAST  "CONTENT");
    if (cur == NULL)
        return(NULL);
    cur = xmlStrcasestr(cur, BAD_CAST  "CHARSET=");
    if (cur == NULL)
        return(NULL);
    cur += 8;
    start = cur;
    while ((IS_ALNUM(*cur)) ||
           (*cur == '-') || (*cur == '_') || (*cur == ':') || (*cur == '/'))
           cur++;
    if (cur == start)
        return(NULL);
    ret = xmlStrndup(start, cur - start);
    if (ret == NULL)
        htmlErrMemory(ctxt);
    return(ret);
}